

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_info.hpp
# Opt level: O2

string * __thiscall
duckdb::CreateInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateInfo *this)

{
  NotImplementedException *this_00;
  allocator local_59;
  string local_58;
  string local_38;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"ToString not supported for this type of CreateInfo: \'%s\'",
             &local_59);
  EnumUtil::ToString<duckdb::ParseInfoType>(&local_58,(this->super_ParseInfo).info_type);
  NotImplementedException::NotImplementedException<std::__cxx11::string>
            (this_00,&local_38,&local_58);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

virtual string ToString() const {
		throw NotImplementedException("ToString not supported for this type of CreateInfo: '%s'",
		                              EnumUtil::ToString(info_type));
	}